

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcfdrivr.c
# Opt level: O0

FT_Error PCF_Size_Select(FT_Size size,FT_ULong strike_index)

{
  FT_Face pFVar1;
  long lVar2;
  PCF_Accel accel;
  FT_ULong strike_index_local;
  FT_Size size_local;
  
  pFVar1 = size->face;
  FT_Select_Metrics(size->face,strike_index);
  lVar2._0_2_ = pFVar1[1].units_per_EM;
  lVar2._2_2_ = pFVar1[1].ascender;
  lVar2._4_2_ = pFVar1[1].descender;
  lVar2._6_2_ = pFVar1[1].height;
  (size->metrics).ascender = lVar2 << 6;
  (size->metrics).descender = *(long *)&pFVar1[1].max_advance_width * -0x40;
  (size->metrics).max_advance = (long)((int)*(short *)((long)&pFVar1[1].memory + 4) << 6);
  return 0;
}

Assistant:

FT_CALLBACK_DEF( FT_Error )
  PCF_Size_Select( FT_Size   size,
                   FT_ULong  strike_index )
  {
    PCF_Accel  accel = &( (PCF_Face)size->face )->accel;


    FT_Select_Metrics( size->face, strike_index );

    size->metrics.ascender    =  accel->fontAscent * 64;
    size->metrics.descender   = -accel->fontDescent * 64;
    size->metrics.max_advance =  accel->maxbounds.characterWidth * 64;

    return FT_Err_Ok;
  }